

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GateTypes.cpp
# Opt level: O0

void slang::ast::builtins::gate
               (Compilation *c,string_view name,
               initializer_list<slang::ast::PrimitivePortDirection> portDirs,
               PrimitiveKind primitiveKind)

{
  int iVar1;
  const_iterator pPVar2;
  const_iterator pPVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *in_RDI;
  PrimitivePortSymbol *port;
  PrimitivePortDirection dir;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<slang::ast::PrimitivePortDirection> *__range2;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> ports;
  PrimitiveSymbol *prim;
  Symbol *in_stack_ffffffffffffff18;
  Scope *in_stack_ffffffffffffff20;
  PrimitivePortSymbol *in_stack_ffffffffffffff28;
  PrimitiveKind *in_stack_ffffffffffffff30;
  SourceLocation *in_stack_ffffffffffffff38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff40;
  Compilation *in_stack_ffffffffffffff48;
  BumpAllocator *in_stack_ffffffffffffff50;
  Compilation *in_stack_ffffffffffffff58;
  PrimitivePortSymbol *in_stack_ffffffffffffff60;
  PrimitiveSymbol *in_stack_ffffffffffffff70;
  Compilation *in_stack_ffffffffffffff78;
  SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> local_78 [2];
  PrimitiveSymbol *local_38;
  EVP_PKEY_CTX *local_28;
  initializer_list<slang::ast::PrimitivePortDirection> local_20 [2];
  
  local_28 = in_RDI;
  local_38 = BumpAllocator::
             emplace<slang::ast::PrimitiveSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation_const&,slang::ast::PrimitiveSymbol::PrimitiveKind&>
                       (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                        in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                        in_stack_ffffffffffffff30);
  Compilation::addGateType(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)0x7629fa);
  pPVar2 = std::initializer_list<slang::ast::PrimitivePortDirection>::begin(local_20);
  pPVar3 = std::initializer_list<slang::ast::PrimitivePortDirection>::end
                     ((initializer_list<slang::ast::PrimitivePortDirection> *)
                      in_stack_ffffffffffffff20);
  src = extraout_RDX;
  for (; pPVar2 != pPVar3; pPVar2 = pPVar2 + 1) {
    in_stack_ffffffffffffff28 =
         BumpAllocator::
         emplace<slang::ast::PrimitivePortSymbol,slang::ast::Compilation&,char_const(&)[1],slang::SourceLocation_const&,slang::ast::PrimitivePortDirection&>
                   ((BumpAllocator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                    (char (*) [1])in_stack_ffffffffffffff50,
                    (SourceLocation *)in_stack_ffffffffffffff48,
                    (PrimitivePortDirection *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff60 = in_stack_ffffffffffffff28;
    Scope::addMember(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::push_back
              ((SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*> *)in_stack_ffffffffffffff20
               ,(PrimitivePortSymbol **)in_stack_ffffffffffffff18);
    src = extraout_RDX_00;
  }
  iVar1 = SmallVectorBase<const_slang::ast::PrimitivePortSymbol_*>::copy(local_78,local_28,src);
  std::span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL>::
  span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL>
            ((span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> *)
             CONCAT44(extraout_var,iVar1),
             (span<const_slang::ast::PrimitivePortSymbol_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff28);
  (local_38->ports)._M_ptr = (pointer)in_stack_ffffffffffffff40;
  (local_38->ports)._M_extent._M_extent_value = (size_t)in_stack_ffffffffffffff48;
  SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL>::~SmallVector
            ((SmallVector<const_slang::ast::PrimitivePortSymbol_*,_5UL> *)0x762b32);
  return;
}

Assistant:

static void gate(Compilation& c, std::string_view name,
                 std::initializer_list<PrimitivePortDirection> portDirs,
                 PrimitiveSymbol::PrimitiveKind primitiveKind = PrimitiveSymbol::Fixed) {
    auto& prim = *c.emplace<PrimitiveSymbol>(c, name, NL, primitiveKind);
    c.addGateType(prim);

    SmallVector<const PrimitivePortSymbol*> ports;
    for (auto dir : portDirs) {
        auto port = c.emplace<PrimitivePortSymbol>(c, "", NL, dir);
        prim.addMember(*port);
        ports.push_back(port);
    }

    prim.ports = ports.copy(c);
}